

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

string * __thiscall
kws::Parser::RemoveComments_abi_cxx11_(string *__return_storage_ptr__,Parser *this,char *buffer)

{
  pointer *pppVar1;
  char *__args;
  char cVar2;
  pointer ppVar3;
  iterator iVar4;
  bool bVar5;
  char cVar6;
  pointer pcVar7;
  string *psVar8;
  byte bVar9;
  size_t sVar10;
  char *pcVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  bool bVar14;
  vector<char,_std::allocator<char>_> outBuffer;
  string tempbuf;
  undefined1 *local_90;
  vector<char,_std::allocator<char>_> local_88;
  char *local_70;
  pair<unsigned_long,_unsigned_long> local_68;
  undefined1 local_58 [16];
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_48;
  string *local_40;
  undefined1 *local_38;
  
  pcVar11 = buffer;
  if (buffer == (char *)0x0) {
    ppVar3 = (this->m_CommentPositions).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_CommentPositions).
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar3) {
      (this->m_CommentPositions).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
    }
    pcVar11 = (this->m_Buffer)._M_dataplus._M_p;
  }
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (char *)0x0;
  local_70 = buffer;
  if (buffer == (char *)0x0) {
    puVar13 = (undefined1 *)(this->m_Buffer)._M_string_length;
  }
  else {
    local_68.first = (unsigned_long)local_58;
    sVar10 = strlen(buffer);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,buffer,buffer + sVar10);
    puVar13 = (undefined1 *)local_68.second;
    if ((undefined1 *)local_68.first != local_58) {
      operator_delete((void *)local_68.first);
    }
  }
  local_40 = __return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::reserve(&local_88,(size_type)(puVar13 + 1));
  if (puVar13 != (undefined1 *)0x0) {
    local_38 = puVar13 + -1;
    local_48 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->m_CommentPositions;
    puVar12 = (undefined1 *)0x0;
    cVar6 = '\0';
    bVar5 = false;
    bVar14 = false;
    local_90 = (undefined1 *)0x0;
    do {
      cVar2 = pcVar11[(long)puVar12];
      if ((cVar2 == '\"') &&
         ((puVar12 == (undefined1 *)0x0 || ((pcVar11 + -1)[(long)puVar12] != '\\')))) {
        bVar14 = (bool)(bVar14 ^ 1);
      }
      __args = pcVar11 + (long)puVar12;
      if (bVar14) {
LAB_001253a6:
        bVar9 = 0;
      }
      else if (bVar5) {
        if (cVar2 == '\n' && cVar6 == -1) {
          local_68.first = (unsigned_long)local_90;
          local_68.second = (unsigned_long)puVar12;
          if (local_70 == (char *)0x0) {
            iVar4._M_current =
                 (this->m_CommentPositions).
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->m_CommentPositions).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                        (local_48,iVar4,&local_68);
            }
            else {
              (iVar4._M_current)->first = (unsigned_long)local_90;
              (iVar4._M_current)->second = (unsigned_long)puVar12;
              pppVar1 = &(this->m_CommentPositions).
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          bVar5 = false;
          cVar6 = '\0';
        }
        if ((*__args != '/') || ((pcVar11 + -1)[(long)puVar12] != '*')) goto LAB_001253a6;
        local_68.second = (unsigned_long)(puVar12 + 1);
        local_68.first = (unsigned_long)local_90;
        if (local_70 == (char *)0x0) {
          iVar4._M_current =
               (this->m_CommentPositions).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->m_CommentPositions).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                      (local_48,iVar4,&local_68);
          }
          else {
            (iVar4._M_current)->first = (unsigned_long)local_90;
            (iVar4._M_current)->second = local_68.second;
            pppVar1 = &(this->m_CommentPositions).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
        }
        bVar9 = 1;
        bVar5 = false;
      }
      else {
        bVar9 = 0;
        if ((puVar12 < local_38) && (cVar2 == '/')) {
          if ((pcVar11 + 1)[(long)puVar12] == '/') {
            bVar5 = true;
            bVar9 = 0;
            cVar6 = '\x01';
            local_90 = puVar12;
          }
          else {
            if ((pcVar11 + 1)[(long)puVar12] != '*') goto LAB_001253a6;
            bVar5 = true;
            bVar9 = 0;
            local_90 = puVar12;
          }
        }
      }
      if (!(bool)(bVar9 | bVar5)) {
        if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_88,
                     (iterator)
                     local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,__args);
        }
        else {
          *local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish = *__args;
          local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar12 = puVar12 + 1;
    } while (puVar13 != puVar12);
  }
  local_68.first = local_68.first & 0xffffffffffffff00;
  if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(char *)&local_68);
  }
  else {
    *local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
     _M_finish = '\0';
    local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  psVar8 = local_40;
  pcVar7 = local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (local_70 == (char *)0x0) {
    pcVar11 = (char *)(this->m_BufferNoComment)._M_string_length;
    strlen(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start);
    std::__cxx11::string::_M_replace((ulong)&this->m_BufferNoComment,0,pcVar11,(ulong)pcVar7);
    (psVar8->_M_dataplus)._M_p = (pointer)&psVar8->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar8,"");
  }
  else {
    (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
    if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (char *)0x0) {
      pcVar11 = (char *)0x1;
    }
    else {
      sVar10 = strlen(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pcVar11 = pcVar7 + sVar10;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)psVar8,pcVar7,pcVar11);
  }
  if (local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_88.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return psVar8;
}

Assistant:

std::string Parser::RemoveComments(const char* buffer)
{
  if(!buffer)
    {
    m_CommentPositions.clear();
    }
  size_t cc;
  const char* inch;
  if(buffer)
    {
    inch = buffer;
    }
  else
    {
    inch = m_Buffer.c_str();
    }

  std::vector<char> outBuffer;
  size_t inStrSize = m_Buffer.size();
  if(buffer)
    {
    std::string tempbuf = buffer;
    inStrSize = tempbuf.size();
    }
  // Reserve enough space for all files. The size will be at least the size of
  // the file.
  outBuffer.reserve(inStrSize+1);

  bool inString  = false;
  bool inComment = false;
  bool copyChar;
  bool cppComment = false;

  size_t beginOfComment = 0;
  size_t endOfComment = 0;

  for ( cc = 0; cc < inStrSize; ++ cc )
    {
    copyChar = true;

    // it is important to know if we are in a string---if we are then
    // we don't care about comment-ish symbols
    //
    // we are starting or ending a string if we find a " without a
    // preceeding '\'
    bool isStringBarrier = (*inch == '"') && (cc == 0 || *(inch-1) != '\\');
    inString = isStringBarrier ? !inString : inString;

    if (!inString)
      {
      if ( !inComment )
        {
        if ( *inch == '/' )
          {
          if ( cc < inStrSize-1 )
            {
            if ( *(inch+1) == '*' )
              {
              inComment = true;
              beginOfComment = cc;
              }
            else if ( *(inch+1) == '/' )
              {
              inComment = true;
              beginOfComment = cc;
              cppComment = true;
              }
            }
          }
        }
      else
        {
        if ( cppComment && *inch == '\n' )
          {
          endOfComment = cc;
          inComment = false;
          copyChar = true;
          cppComment = false;
          PairType pair(beginOfComment, endOfComment);
          if(!buffer)
            {
            m_CommentPositions.push_back(pair);
            }
          }
        if ( *inch == '/' )
          {
          if ( cc != std::string::npos && *(inch-1) == '*' )
            {
            endOfComment = cc+1;
            inComment = false;
            copyChar = false;
            PairType pair(beginOfComment, endOfComment);
            if(!buffer)
              {
              m_CommentPositions.push_back(pair);
              }
            }
          }
        }
      }
    if ( inComment )
      {
      copyChar = false;
      }
    if ( copyChar )
      {
      outBuffer.push_back(*inch);
      }
    inch++;
    }
  outBuffer.push_back(0);
  if(buffer)
    {
    return &*outBuffer.begin();
    }
  else
    {
    m_BufferNoComment = &*outBuffer.begin();
    }

  return "";
}